

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

int __thiscall Sudoku::doplnM(Sudoku *this,int x,int y,int cislo)

{
  byte bVar1;
  int iVar2;
  uint zakazano;
  int cislo_local;
  int y_local;
  int x_local;
  Sudoku *this_local;
  
  if ((((-1 < x) && (x < 9)) && (-1 < y)) &&
     ((y < 9 && ((*(byte *)((this->s).pole + (y * 9 + x)) >> 4 & 1) == 0)))) {
    bVar1 = (byte)cislo;
    if ((1 << (bVar1 & 0x1f) &
        (((this->s).radky[y] | (this->s).sloupce[x] | (this->s).ctverce[x / 3][y / 3]) ^ 0xffffffff)
        ) == 0) {
      (this->s).rozbite = 1;
    }
    iVar2 = y * 9 + x;
    *(byte *)((this->s).pole + iVar2) = *(byte *)((this->s).pole + iVar2) & 0xf0 | bVar1 & 0xf;
    (this->s).radky[y] = 1 << (bVar1 & 0x1f) | (this->s).radky[y];
    (this->s).sloupce[x] = 1 << (bVar1 & 0x1f) | (this->s).sloupce[x];
    (this->s).ctverce[x / 3][y / 3] = 1 << (bVar1 & 0x1f) | (this->s).ctverce[x / 3][y / 3];
    (this->s).doplnenych = (this->s).doplnenych + 1;
  }
  return 0;
}

Assistant:

int Sudoku::doplnM (int x, int y, int cislo)
{
  // jsme v mezich hraciho pole?
  if(0 <= x && x < 9)
    if(0 <= y && y < 9)
    {
      if(s.pole[y*9+x].pevne)// neprepisujeme pevna cisla
        return false;
      unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3]; // prusecik mnozin zakazanych hodnot
      if(!((1 << cislo) & ~zakazano)) // je zakazano doplnit cislo na policko?
      {
        s.rozbite = true; // doplnujeme manualne, tudiz toto vede k doplneni a neplatnosti hraci plochy
      }
      s.pole[y*9+x].zapsane = cislo;// zapiseme cislo na uvedenou pozici
      // zakazeme pouzit cislo v radku, sloupci a ctverci
      s.radky[y] |= (1 << cislo);
      s.sloupce[x] |= (1 << cislo);
      s.ctverce[x/3][y/3] |= (1 << cislo);
      s.doplnenych++;
    }
  return false;
}